

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node * __thiscall pugi::xml_node::path_abi_cxx11_(xml_node *this,char_t delimiter)

{
  undefined1 *puVar1;
  size_t sVar2;
  void *__dest;
  undefined1 in_DL;
  undefined7 in_register_00000031;
  size_t *psVar3;
  size_t local_78;
  size_t length;
  xml_node_struct *j;
  size_t local_30;
  xml_node_struct *i;
  size_t offset;
  char_t delimiter_local;
  xml_node *this_local;
  string_t *result;
  
  psVar3 = (size_t *)CONCAT71(in_register_00000031,delimiter);
  if (*psVar3 == 0) {
    std::__cxx11::string::string((string *)this);
  }
  else {
    i = (xml_node_struct *)0x0;
    for (local_30 = *psVar3; local_30 != 0; local_30 = *(size_t *)(local_30 + 0x18)) {
      sVar2 = *psVar3;
      if (*(long *)(local_30 + 8) == 0) {
        local_78 = 0;
      }
      else {
        local_78 = impl::anon_unknown_0::strlength(*(char_t **)(local_30 + 8));
      }
      i = (xml_node_struct *)((long)&i->header + local_78 + (local_30 != sVar2));
    }
    std::__cxx11::string::string((string *)this);
    std::__cxx11::string::resize((ulong)this);
    for (length = *psVar3; length != 0; length = *(size_t *)(length + 0x18)) {
      if (length != *psVar3) {
        i = (xml_node_struct *)((long)&i[-1].first_attribute + 7);
        puVar1 = (undefined1 *)std::__cxx11::string::operator[]((ulong)this);
        *puVar1 = in_DL;
      }
      if (*(long *)(length + 8) != 0) {
        sVar2 = impl::anon_unknown_0::strlength(*(char_t **)(length + 8));
        i = (xml_node_struct *)((long)i - sVar2);
        __dest = (void *)std::__cxx11::string::operator[]((ulong)this);
        memcpy(__dest,*(void **)(length + 8),sVar2);
      }
    }
    if (i != (xml_node_struct *)0x0) {
      __assert_fail("offset == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x1846,"string_t pugi::xml_node::path(char_t) const");
    }
  }
  return this;
}

Assistant:

PUGI__FN string_t xml_node::path(char_t delimiter) const
	{
		if (!_root) return string_t();

		size_t offset = 0;

		for (xml_node_struct* i = _root; i; i = i->parent)
		{
			offset += (i != _root);
			offset += i->name ? impl::strlength(i->name) : 0;
		}

		string_t result;
		result.resize(offset);

		for (xml_node_struct* j = _root; j; j = j->parent)
		{
			if (j != _root)
				result[--offset] = delimiter;

			if (j->name)
			{
				size_t length = impl::strlength(j->name);

				offset -= length;
				memcpy(&result[offset], j->name, length * sizeof(char_t));
			}
		}

		assert(offset == 0);

		return result;
	}